

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseType(State *state)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 uVar7;
  undefined2 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  undefined4 uVar15;
  undefined2 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  int iVar19;
  short sVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  char *pcVar24;
  undefined **ppuVar25;
  State copy;
  State copy_1;
  
  pcVar2 = state->mangled_cur;
  pcVar3 = state->out_cur;
  pcVar4 = state->out_begin;
  pcVar5 = state->out_end;
  pcVar6 = state->prev_name;
  uVar7 = state->prev_name_length;
  uVar8 = state->nest_level;
  uVar9 = state->append;
  uVar10 = state->overflowed;
  bVar22 = ParseCVQualifiers(state);
  if ((bVar22) && (bVar22 = ParseType(state), bVar22)) {
    return true;
  }
  state->prev_name = pcVar6;
  state->prev_name_length = uVar7;
  state->nest_level = uVar8;
  state->append = (bool)uVar9;
  state->overflowed = (bool)uVar10;
  state->out_begin = pcVar4;
  state->out_end = pcVar5;
  state->mangled_cur = pcVar2;
  state->out_cur = pcVar3;
  bVar22 = ParseCharClass(state,"OPRCG");
  if ((bVar22) && (bVar22 = ParseType(state), bVar22)) {
    return true;
  }
  state->prev_name = pcVar6;
  state->prev_name_length = uVar7;
  state->nest_level = uVar8;
  state->append = (bool)uVar9;
  state->overflowed = (bool)uVar10;
  state->out_begin = pcVar4;
  state->out_end = pcVar5;
  state->mangled_cur = pcVar2;
  state->out_cur = pcVar3;
  bVar22 = ParseTwoCharToken(state,"Dp");
  if ((bVar22) && (bVar22 = ParseType(state), bVar22)) {
    return true;
  }
  state->mangled_cur = pcVar2;
  state->out_cur = pcVar3;
  state->prev_name = pcVar6;
  state->prev_name_length = uVar7;
  state->nest_level = uVar8;
  state->append = (bool)uVar9;
  state->overflowed = (bool)uVar10;
  state->out_begin = pcVar4;
  state->out_end = pcVar5;
  if (*state->mangled_cur == 'D') {
    state->mangled_cur = state->mangled_cur + 1;
    bVar22 = ParseCharClass(state,"tT");
    if (((!bVar22) || (bVar22 = ParseExpression(state), !bVar22)) ||
       (pcVar24 = state->mangled_cur, *pcVar24 != 'E')) goto LAB_00113e18;
LAB_00113ef7:
    state->mangled_cur = pcVar24 + 1;
  }
  else {
LAB_00113e18:
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    if (*state->mangled_cur == 'U') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar22 = ParseSourceName(state);
      if ((bVar22) && (bVar22 = ParseType(state), bVar22)) {
        return true;
      }
    }
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    cVar1 = *state->mangled_cur;
    for (ppuVar25 = &PTR_anon_var_dwarf_b4c5_0012f618; ppuVar25[-1] != (char *)0x0;
        ppuVar25 = ppuVar25 + 2) {
      if (cVar1 == *ppuVar25[-1]) {
        MaybeAppend(state,*ppuVar25);
        state->mangled_cur = state->mangled_cur + 1;
        return true;
      }
    }
    if (cVar1 == 'u') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar22 = ParseSourceName(state);
      if (bVar22) {
        return true;
      }
    }
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    pcVar24 = state->mangled_cur;
    if (*pcVar24 == 'F') {
      state->mangled_cur = pcVar24 + 1;
      if (pcVar24[1] == 'Y') {
        state->mangled_cur = pcVar24 + 2;
      }
      bVar22 = ParseBareFunctionType(state);
      if ((bVar22) && (pcVar24 = state->mangled_cur, *pcVar24 == 'E')) goto LAB_00113ef7;
    }
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    bVar22 = ParseName(state);
    if (bVar22) {
      return true;
    }
    pcVar24 = state->mangled_cur;
    pcVar11 = state->out_cur;
    pcVar12 = state->out_begin;
    pcVar13 = state->out_end;
    pcVar14 = state->prev_name;
    uVar15 = state->prev_name_length;
    uVar16 = state->nest_level;
    uVar17 = state->append;
    uVar18 = state->overflowed;
    if (*state->mangled_cur == 'A') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar22 = ParseNumber(state,(int *)0x0);
      if ((bVar22) && (*state->mangled_cur == '_')) {
        state->mangled_cur = state->mangled_cur + 1;
        bVar22 = ParseType(state);
        if (bVar22) {
          return true;
        }
      }
    }
    state->mangled_cur = pcVar24;
    state->out_cur = pcVar11;
    state->prev_name = pcVar14;
    state->prev_name_length = uVar15;
    state->nest_level = uVar16;
    state->append = (bool)uVar17;
    state->overflowed = (bool)uVar18;
    state->out_begin = pcVar12;
    state->out_end = pcVar13;
    if (*state->mangled_cur == 'A') {
      state->mangled_cur = state->mangled_cur + 1;
      ParseExpression(state);
      if (*state->mangled_cur == '_') {
        state->mangled_cur = state->mangled_cur + 1;
        bVar22 = ParseType(state);
        if (bVar22) {
          return true;
        }
      }
    }
    state->prev_name = pcVar14;
    state->prev_name_length = uVar15;
    state->nest_level = uVar16;
    state->append = (bool)uVar17;
    state->overflowed = (bool)uVar18;
    state->out_begin = pcVar12;
    state->out_end = pcVar13;
    state->mangled_cur = pcVar24;
    state->out_cur = pcVar11;
    pcVar24 = state->mangled_cur;
    pcVar11 = state->out_cur;
    pcVar12 = state->out_begin;
    pcVar13 = state->out_end;
    pcVar14 = state->prev_name;
    iVar19 = state->prev_name_length;
    sVar20 = state->nest_level;
    bVar22 = state->append;
    bVar21 = state->overflowed;
    if (*state->mangled_cur == 'M') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar23 = ParseType(state);
      if ((bVar23) && (bVar23 = ParseType(state), bVar23)) {
        return true;
      }
    }
    state->prev_name = pcVar14;
    state->prev_name_length = iVar19;
    state->nest_level = sVar20;
    state->append = bVar22;
    state->overflowed = bVar21;
    state->out_begin = pcVar12;
    state->out_end = pcVar13;
    state->mangled_cur = pcVar24;
    state->out_cur = pcVar11;
    bVar22 = ParseSubstitution(state);
    if (bVar22) {
      return true;
    }
    bVar22 = ParseTemplateParam(state);
    if (((!bVar22) && (bVar22 = ParseSubstitution(state), !bVar22)) ||
       (bVar22 = ParseTemplateArgs(state), !bVar22)) {
      state->prev_name = pcVar6;
      state->prev_name_length = uVar7;
      state->nest_level = uVar8;
      state->append = (bool)uVar9;
      state->overflowed = (bool)uVar10;
      state->out_begin = pcVar4;
      state->out_end = pcVar5;
      state->mangled_cur = pcVar2;
      state->out_cur = pcVar3;
      bVar22 = ParseTemplateParam(state);
      return bVar22;
    }
  }
  return true;
}

Assistant:

static bool ParseType(State *state) {
  // We should check CV-qualifers, and PRGC things first.
  State copy = *state;
  if (ParseCVQualifiers(state) && ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseCharClass(state, "OPRCG") && ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "Dp") && ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'D') && ParseCharClass(state, "tT") &&
      ParseExpression(state) && ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'U') && ParseSourceName(state) &&
      ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseBuiltinType(state) ||
      ParseFunctionType(state) ||
      ParseClassEnumType(state) ||
      ParseArrayType(state) ||
      ParsePointerToMemberType(state) ||
      ParseSubstitution(state)) {
    return true;
  }

  if (ParseTemplateTemplateParam(state) &&
      ParseTemplateArgs(state)) {
    return true;
  }
  *state = copy;

  // Less greedy than <template-template-param> <template-args>.
  if (ParseTemplateParam(state)) {
    return true;
  }

  return false;
}